

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontDescriptorWriter.cpp
# Opt level: O0

uint __thiscall
FontDescriptorWriter::CalculateFlags
          (FontDescriptorWriter *this,FreeTypeFaceWrapper *inFontInfo,
          UIntAndGlyphEncodingInfoVector *inEncodedGlyphs)

{
  bool bVar1;
  uint local_24;
  uint flags;
  UIntAndGlyphEncodingInfoVector *inEncodedGlyphs_local;
  FreeTypeFaceWrapper *inFontInfo_local;
  FontDescriptorWriter *this_local;
  
  bVar1 = FreeTypeFaceWrapper::IsFixedPitch(inFontInfo);
  local_24 = (uint)bVar1;
  bVar1 = FreeTypeFaceWrapper::IsSerif(inFontInfo);
  if (bVar1) {
    local_24 = local_24 | 2;
  }
  bVar1 = IsSymbolic(this,inFontInfo,inEncodedGlyphs);
  if (bVar1) {
    local_24 = local_24 | 4;
  }
  else {
    local_24 = local_24 | 0x20;
  }
  bVar1 = FreeTypeFaceWrapper::IsScript(inFontInfo);
  if (bVar1) {
    local_24 = local_24 | 8;
  }
  bVar1 = FreeTypeFaceWrapper::IsItalic(inFontInfo);
  if (bVar1) {
    local_24 = local_24 | 0x40;
  }
  bVar1 = FreeTypeFaceWrapper::IsForceBold(inFontInfo);
  if (bVar1) {
    local_24 = local_24 | 0x40000;
  }
  return local_24;
}

Assistant:

unsigned int FontDescriptorWriter::CalculateFlags(	FreeTypeFaceWrapper* inFontInfo,
													const UIntAndGlyphEncodingInfoVector& inEncodedGlyphs)
{
	unsigned int flags = 0;

	// see FreeTypeFaceWrapper::GetFontFlags for explanation, if you must

	if(inFontInfo->IsFixedPitch())
		flags |= 1;
	if(inFontInfo->IsSerif())
		flags |= 2;
	if(IsSymbolic(inFontInfo,inEncodedGlyphs))
		flags |= 4;
	else
		flags |= 32;
	if(inFontInfo->IsScript())
		flags |= 8;
	if(inFontInfo->IsItalic())
		flags |= 64;
	if(inFontInfo->IsForceBold())
		flags |= (1<<18);

	return flags;
	
}